

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

void icu_63::Transliterator::registerInstance(Transliterator *adoptedPrototype)

{
  UBool UVar1;
  UErrorCode local_1c;
  UErrorCode ec;
  Mutex lock;
  Transliterator *adoptedPrototype_local;
  
  lock.fMutex = (UMutex *)adoptedPrototype;
  Mutex::Mutex((Mutex *)&stack0xffffffffffffffe8,&registryMutex);
  local_1c = U_ZERO_ERROR;
  if (registry == (TransliteratorRegistry *)0x0) {
    UVar1 = initializeRegistry(&local_1c);
    if (UVar1 == '\0') goto LAB_002e4c66;
  }
  _registerInstance((Transliterator *)lock.fMutex);
LAB_002e4c66:
  Mutex::~Mutex((Mutex *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void U_EXPORT2 Transliterator::registerInstance(Transliterator* adoptedPrototype) {
    Mutex lock(&registryMutex);
    UErrorCode ec = U_ZERO_ERROR;
    if (HAVE_REGISTRY(ec)) {
        _registerInstance(adoptedPrototype);
    }
}